

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_readSkippableFrame
                 (void *dst,size_t dstCapacity,uint *magicVariant,void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  size_t size;
  void *in_RCX;
  int *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  ulong in_R8;
  size_t skippableContentSize;
  size_t skippableFrameSize;
  U32 magicNumber;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  size_t local_8;
  
  if (in_R8 < 8) {
    local_8 = 0xffffffffffffffb8;
  }
  else {
    UVar1 = MEM_readLE32(in_stack_ffffffffffffffb8);
    size = readSkippableFrameSize(in_RCX,in_R8);
    local_8 = size - 8;
    uVar2 = ZSTD_isSkippableFrame((void *)CONCAT44(UVar1,in_stack_ffffffffffffffc8),size);
    if (uVar2 == 0) {
      local_8 = 0xfffffffffffffff2;
    }
    else if ((size < 8) || (in_R8 < size)) {
      local_8 = 0xffffffffffffffb8;
    }
    else if (in_RSI < local_8) {
      local_8 = 0xffffffffffffffba;
    }
    else {
      if ((local_8 != 0) && (in_RDI != (void *)0x0)) {
        memcpy(in_RDI,(void *)((long)in_RCX + 8),local_8);
      }
      if (in_RDX != (int *)0x0) {
        *in_RDX = UVar1 + 0xe7b2d5b0;
      }
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_readSkippableFrame(void* dst, size_t dstCapacity,
                               unsigned* magicVariant,  /* optional, can be NULL */
                         const void* src, size_t srcSize)
{
    RETURN_ERROR_IF(srcSize < ZSTD_SKIPPABLEHEADERSIZE, srcSize_wrong, "");

    {   U32 const magicNumber = MEM_readLE32(src);
        size_t skippableFrameSize = readSkippableFrameSize(src, srcSize);
        size_t skippableContentSize = skippableFrameSize - ZSTD_SKIPPABLEHEADERSIZE;

        /* check input validity */
        RETURN_ERROR_IF(!ZSTD_isSkippableFrame(src, srcSize), frameParameter_unsupported, "");
        RETURN_ERROR_IF(skippableFrameSize < ZSTD_SKIPPABLEHEADERSIZE || skippableFrameSize > srcSize, srcSize_wrong, "");
        RETURN_ERROR_IF(skippableContentSize > dstCapacity, dstSize_tooSmall, "");

        /* deliver payload */
        if (skippableContentSize > 0  && dst != NULL)
            ZSTD_memcpy(dst, (const BYTE *)src + ZSTD_SKIPPABLEHEADERSIZE, skippableContentSize);
        if (magicVariant != NULL)
            *magicVariant = magicNumber - ZSTD_MAGIC_SKIPPABLE_START;
        return skippableContentSize;
    }
}